

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::get_unit(string *unit_string,uint64_t match_flags)

{
  char cVar1;
  undefined4 uVar2;
  precise_unit pVar3;
  precise_unit pVar4;
  bool bVar5;
  int iVar6;
  unit_data uVar7;
  uint uVar8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  _Var9;
  size_t sVar10;
  const_iterator cVar11;
  precise_unit *ppVar12;
  long lVar13;
  ulong uVar14;
  precise_unit pVar15;
  precise_unit actUnit;
  uint64_t h1;
  char *ptr;
  ulong local_28;
  char *local_20;
  
  if ((((_ZN5unitsL21allowUserDefinedUnitsE_0 & 1) != 0) &&
      (user_defined_units_abi_cxx11_._24_8_ != 0)) &&
     (_Var9._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)user_defined_units_abi_cxx11_,unit_string),
     _Var9._M_cur != (__node_type *)0x0)) {
LAB_003e3e16:
    return *(precise_unit *)
            ((long)&((_Var9._M_cur)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
                    ._M_storage._M_storage + 0x20);
  }
  uVar14 = match_flags & 0xff;
  if ((match_flags & 0xff) == 0) {
    uVar14 = unitsDomain;
  }
  if (uVar14 != 0) {
    sVar10 = CLI::std::
             hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_28,(string *)unit_string);
    local_28 = sVar10 ^ uVar14;
    cVar11 = std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_units::precise_unit>,_std::allocator<std::pair<const_unsigned_long,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_units::precise_unit>,_std::allocator<std::pair<const_unsigned_long,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)domainSpecificUnit,&local_28);
    ppVar12 = (precise_unit *)&precise::invalid;
    if (cVar11.super__Node_iterator_base<std::pair<const_unsigned_long,_units::precise_unit>,_false>
        ._M_cur != (__node_type *)0x0) {
      ppVar12 = (precise_unit *)
                ((long)cVar11.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_units::precise_unit>,_false>
                       ._M_cur + 0x10);
    }
    uVar2 = ppVar12->base_units_;
    if (uVar2 != -0x56b5b78 || !NAN(ppVar12->multiplier_)) {
      return *ppVar12;
    }
  }
  _Var9._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)base_unit_vals_abi_cxx11_,unit_string);
  if (_Var9._M_cur != (__node_type *)0x0) goto LAB_003e3e16;
  cVar1 = *(unit_string->_M_dataplus)._M_p;
  pVar3.base_units_ = (unit_data)0xfa94a488;
  pVar3.commodity_ = 0;
  pVar3.multiplier_ = NAN;
  pVar15.base_units_ = (unit_data)0xfa94a488;
  pVar15.commodity_ = 0;
  pVar15.multiplier_ = NAN;
  if ((cVar1 != 'E') && (cVar1 != 'C')) {
    return pVar15;
  }
  if (unit_string->_M_string_length < 6) {
    return pVar3;
  }
  iVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0
                  ,5,"CXUN[");
  if ((iVar6 == 0) && (bVar5 = hasAdditionalOps(unit_string), !bVar5)) {
    local_20 = (char *)0x0;
    lVar13 = strtol((unit_string->_M_dataplus)._M_p + 5,&local_20,0);
    if (*local_20 != ']') goto LAB_003e3eab;
    uVar7 = precise::custom::custom_unit((uint16_t)lVar13);
LAB_003e3f47:
    uVar14 = (ulong)(uint)uVar7;
LAB_003e3ff2:
    actUnit.base_units_ = (unit_data)(int)uVar14;
    actUnit.commodity_ = (int)(uVar14 >> 0x20);
    actUnit.multiplier_ = 1.0;
    pVar15 = commoditizedUnit(unit_string,actUnit,&local_28);
    return pVar15;
  }
LAB_003e3eab:
  iVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0
                  ,6,"CXCUN[");
  if ((iVar6 == 0) && (bVar5 = hasAdditionalOps(unit_string), !bVar5)) {
    local_20 = (char *)0x0;
    lVar13 = strtol((unit_string->_M_dataplus)._M_p + 6,&local_20,0);
    if (*local_20 == ']') {
      uVar8 = (((uint)lVar13 & 7) << 0x18 | 0xc00) << 4 | 0x50000;
      uVar8 = (uVar8 >> 2 & 0x10013000) + (uVar8 & 0x30010000) * 4;
      uVar7 = (unit_data)
              ((uVar8 >> 1 & 0x40001000) + (uVar8 & 0x50051000) * 2 >> 1 |
              (int)((uint)lVar13 << 0x1c) >> 0x11 & 0xc000U);
      goto LAB_003e3f47;
    }
  }
  iVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0
                  ,6,"EQXUN[");
  if ((iVar6 == 0) && (bVar5 = hasAdditionalOps(unit_string), !bVar5)) {
    local_20 = (char *)0x0;
    lVar13 = strtol((unit_string->_M_dataplus)._M_p + 6,&local_20,0);
    if (*local_20 == ']') {
      uVar8 = (uint)lVar13;
      uVar14 = (ulong)((uVar8 & 1) << 0x1e | (uVar8 & 0x10) << 0x11 | (uVar8 & 8) << 0x17 |
                       (uVar8 & 4) << 0x1a | (uVar8 & 2) << 0x1c) | 0x80000000;
      goto LAB_003e3ff2;
    }
  }
  pVar4.base_units_ = (unit_data)0xfa94a488;
  pVar4.commodity_ = 0;
  pVar4.multiplier_ = NAN;
  return pVar4;
}

Assistant:

static precise_unit
    get_unit(const std::string& unit_string, std::uint64_t match_flags)
{
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        if (!user_defined_units.empty()) {
            auto fnd2 = user_defined_units.find(unit_string);
            if (fnd2 != user_defined_units.end()) {
                return fnd2->second;
            }
        }
    }

    auto cdomain = getCurrentDomain(match_flags);
    if (cdomain != domains::defaultDomain) {
        auto dmunit = getDomainUnit(cdomain, unit_string);
        if (is_valid(dmunit)) {
            return dmunit;
        }
    }

    auto fnd = base_unit_vals.find(unit_string);
    if (fnd != base_unit_vals.end()) {
        return fnd->second;
    }
    // empty string would have been found already
    auto c = unit_string.front();
    if ((c == 'C' || c == 'E') && unit_string.size() >= 6) {
        size_t index{0};
        if (unit_string.compare(0, 5, "CXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 5, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string, precise::generate_custom_unit(num), index);
                }
            }
        }
        if (unit_string.compare(0, 6, "CXCUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise::generate_custom_count_unit(num),
                        index);
                }
            }
        }
        if (unit_string.compare(0, 6, "EQXUN[") == 0) {
            if (!hasAdditionalOps(unit_string)) {
                char* ptr = nullptr;
                auto num = static_cast<std::uint16_t>(
                    strtol(unit_string.c_str() + 6, &ptr, 0));
                if (*ptr == ']') {
                    return commoditizedUnit(
                        unit_string,
                        precise_unit(precise::custom::equation_unit(num)),
                        index);
                }
            }
        }
    }
    return precise::invalid;
}